

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O1

void __thiscall BamTools::Internal::BamToolsIndex::LoadHeader(BamToolsIndex *this)

{
  uint32_t *puVar1;
  uint uVar2;
  IBamIODevice *pIVar3;
  int iVar4;
  undefined4 extraout_var;
  BamException *this_00;
  string local_68;
  string local_48;
  
  CheckMagicNumber(this);
  CheckVersion(this);
  pIVar3 = (this->m_resources).Device;
  puVar1 = &this->m_blockSize;
  iVar4 = (*pIVar3->_vptr_IBamIODevice[5])(pIVar3,puVar1,4);
  if (this->m_isBigEndian == true) {
    uVar2 = *puVar1;
    *puVar1 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  }
  if (CONCAT44(extraout_var,iVar4) == 4) {
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"BamToolsIndex::LoadHeader","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"could not read BTI block size","");
  BamException::BamException(this_00,&local_48,&local_68);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamToolsIndex::LoadHeader()
{

    // check BTI file metadata
    CheckMagicNumber();
    CheckVersion();

    // use file's BTI block size to set member variable
    const int64_t numBytesRead = m_resources.Device->Read((char*)&m_blockSize, sizeof(m_blockSize));
    if (m_isBigEndian) {
        SwapEndian_32(m_blockSize);
    }
    if (numBytesRead != sizeof(m_blockSize)) {
        throw BamException("BamToolsIndex::LoadHeader", "could not read BTI block size");
    }
}